

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O0

double Alg::min_vector_nonzero(vector<double,_std::allocator<double>_> *budget_list)

{
  double dVar1;
  bool bVar2;
  reference pdVar3;
  double i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  double esp;
  double tmp;
  vector<double,_std::allocator<double>_> *budget_list_local;
  
  esp = 4294967295.0;
  __end1 = std::vector<double,_std::allocator<double>_>::begin(budget_list);
  i = (double)std::vector<double,_std::allocator<double>_>::end(budget_list);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)&i);
    if (!bVar2) break;
    pdVar3 = __gnu_cxx::
             __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end1);
    dVar1 = *pdVar3;
    if ((dVar1 < esp) && (0.0001 < ABS(dVar1))) {
      esp = dVar1;
    }
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1);
  }
  return esp;
}

Assistant:

double Alg::min_vector_nonzero(const std::vector<double> & budget_list) {
    double tmp = WINT_MAX;
    const double esp = 0.0001;
    for (double i : budget_list) {
        if (i < tmp && fabs(i) > esp) {
            tmp = i;
        }
    }
    return tmp;
}